

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O2

void __thiscall Json::JsonArray::__toList(JsonArray *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  value_type *pvVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  value_type *__x;
  __shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<Json::JsonValue> jsonValue;
  
  this_00 = &this->__lstJsonText;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  p_Var3 = &((this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  local_48 = &((this->__lstJsonArray).
               super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  uVar4 = (long)local_48 - (long)p_Var3;
  iVar5 = 0;
  for (; p_Var3 != local_48; p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&jsonValue.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    iVar2 = (*(jsonValue.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_JsonValue[10])();
    pvVar1 = (value_type *)((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    for (__x = *(value_type **)CONCAT44(extraout_var,iVar2); __x != pvVar1; __x = __x + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,__x);
    }
    iVar5 = iVar5 + 1;
    if (iVar5 < (int)(uVar4 >> 4)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&jsonValue.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void Json::JsonArray::__toList() {
    __lstJsonText.clear();
    __lstJsonText.push_back(_JSCS(JSON_ARRAY_BEGIN));
    int __index = 0, __size = __lstJsonArray.size();
    for (std::shared_ptr<JsonValue> jsonValue : __lstJsonArray) {
        for (auto &&p : jsonValue->toList()) __lstJsonText.push_back(p);
        __index++;
        if (__index < __size) __lstJsonText.push_back(_JSCS(JSON_SEPARATE));
    }
    __lstJsonText.push_back(_JSCS(JSON_ARRAY_END));
}